

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::Identity(TPZMatrix<std::complex<long_double>_> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  int64_t iVar5;
  TPZBaseMatrix *in_RDI;
  int64_t col;
  int64_t row;
  char *in_stack_00000148;
  char *in_stack_00000150;
  complex<long_double> local_58;
  complex<long_double> local_38;
  long local_18;
  long local_10;
  
  iVar4 = TPZBaseMatrix::Cols(in_RDI);
  iVar5 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar4 != iVar5) {
    Error(in_stack_00000150,in_stack_00000148);
  }
  local_10 = 0;
  while( true ) {
    lVar1 = local_10;
    iVar4 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar4 <= lVar1) break;
    local_18 = 0;
    while( true ) {
      lVar1 = local_18;
      iVar4 = TPZBaseMatrix::Cols(in_RDI);
      lVar3 = local_10;
      lVar2 = local_18;
      if (iVar4 <= lVar1) break;
      if (local_10 == local_18) {
        std::complex<long_double>::complex(&local_38,(longdouble)1,(longdouble)0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar3,lVar2,&local_38);
      }
      else {
        std::complex<long_double>::complex(&local_58,(longdouble)0,(longdouble)0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar3,lVar2,&local_58);
      }
      local_18 = local_18 + 1;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Identity() {
	
    if ( Cols() != Rows() ) {
        Error( "identity (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,1.):PutVal(row,col,0.);
        }
    }
}